

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O0

void decodeModrm(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  int iVar1;
  byte *pbVar2;
  UInt8 *modrm;
  PDISASM pMyDisasm_local;
  OPTYPE *pMyOperand_local;
  
  (pMyDisasm->Reserved_).DECALAGE_EIP = 0;
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    pbVar2 = (byte *)((pMyDisasm->Reserved_).EIP_ + 1);
    (pMyDisasm->Reserved_).MOD_ = (uint)(*pbVar2 >> 6);
    (pMyDisasm->Reserved_).RM_ = *pbVar2 & 7;
    switch((pMyDisasm->Reserved_).MOD_) {
    case 0:
      (*ModRM_0[(pMyDisasm->Reserved_).RM_])(pMyOperand,pMyDisasm);
      break;
    case 1:
      (pMyDisasm->Reserved_).DECALAGE_EIP = (pMyDisasm->Reserved_).DECALAGE_EIP + 1;
      iVar1 = Security(3,pMyDisasm);
      if (iVar1 != 0) {
        (*ModRM_1[(pMyDisasm->Reserved_).RM_])(pMyOperand,pMyDisasm);
      }
      break;
    case 2:
      if ((pMyDisasm->Reserved_).AddressSize < 0x20) {
        (pMyDisasm->Reserved_).DECALAGE_EIP = (pMyDisasm->Reserved_).DECALAGE_EIP + 2;
        iVar1 = Security(4,pMyDisasm);
      }
      else {
        (pMyDisasm->Reserved_).DECALAGE_EIP = (pMyDisasm->Reserved_).DECALAGE_EIP + 4;
        iVar1 = Security(6,pMyDisasm);
      }
      if (iVar1 != 0) {
        (*ModRM_2[(pMyDisasm->Reserved_).RM_])(pMyOperand,pMyDisasm);
      }
      break;
    case 3:
      (*ModRM_3[(pMyDisasm->Reserved_).RM_])(pMyOperand,pMyDisasm);
    }
  }
  return;
}

Assistant:

void __bea_callspec__ decodeModrm(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
  UInt8* modrm;
  GV.DECALAGE_EIP = 0;
  if (!Security(2, pMyDisasm)) return;
  modrm = (UInt8*) (GV.EIP_ + 1);
  GV.MOD_ = (*modrm >> 6) & 0x3;
  GV.RM_  = *modrm & 0x7;
  switch(GV.MOD_) {
    case 0:
      ModRM_0[GV.RM_](pMyOperand, pMyDisasm);
      break;
    case 1:
      GV.DECALAGE_EIP++;
      if (!Security(3, pMyDisasm)) return;
      ModRM_1[GV.RM_](pMyOperand, pMyDisasm);
      break;
    case 2:
      if (GV.AddressSize >= 32) {
        GV.DECALAGE_EIP += 4;
        if (!Security(6, pMyDisasm)) return;
      }
      else {
        GV.DECALAGE_EIP += 2;
        if (!Security(4, pMyDisasm)) return;
      }
      ModRM_2[GV.RM_](pMyOperand, pMyDisasm);
      break;
    case 3:
      ModRM_3[GV.RM_](pMyOperand, pMyDisasm);
  }
}